

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clone.cpp
# Opt level: O0

void __thiscall helics::apps::Clone::initialize(Clone *this)

{
  TimeRepresentation<count_time<9,_long>_> *this_00;
  size_type in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  Federate *in_stack_00000010;
  IterationRequest in_stack_00000057;
  Federate *in_stack_00000058;
  int in_stack_000001bc;
  Clone *in_stack_000001c0;
  Time in_stack_000001c8;
  Clone *in_stack_000002c0;
  double in_stack_ffffffffffffffc8;
  uint in_stack_fffffffffffffff0;
  size_type __new_size;
  
  __new_size = in_RDI;
  generateInterfaces(in_stack_000002c0);
  this_00 = (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 600);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::size((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
          *)0x41ffc7);
  CLI::std::vector<int,_std::allocator<int>_>::resize
            (unaff_retaddr,__new_size,(value_type_conflict1 *)(ulong)in_stack_fffffffffffffff0);
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x41ffef);
  Federate::enterInitializingMode(in_stack_00000010);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation(this_00,in_stack_ffffffffffffffc8);
  captureForCurrentTime(in_stack_000001c0,in_stack_000001c8,in_stack_000001bc);
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x42002f);
  Federate::enterExecutingMode(in_stack_00000058,in_stack_00000057);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation(this_00,in_stack_ffffffffffffffc8);
  captureForCurrentTime(in_stack_000001c0,in_stack_000001c8,in_stack_000001bc);
  return;
}

Assistant:

void Clone::initialize()
{
    generateInterfaces();

    pubPointCount.resize(subids.size(), 0);

    fed->enterInitializingMode();
    captureForCurrentTime(-1.0);

    fed->enterExecutingMode();
    captureForCurrentTime(0.0);
}